

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superscalar.cpp
# Opt level: O2

int randomx::scheduleUop<false>(type uop,type (*portBusy) [174] [3],int cycle)

{
  long lVar1;
  type *ptVar2;
  
  lVar1 = (long)cycle;
  ptVar2 = (*portBusy)[lVar1] + 2;
  for (; lVar1 < 0xae; lVar1 = lVar1 + 1) {
    if (((((uop & 4U) != 0) && (*ptVar2 == 0)) ||
        (((uop & 1U) != 0 && ((*(type (*) [3])(ptVar2 + -2))[0] == 0)))) ||
       (((uop & 2U) != 0 && (ptVar2[-1] == 0)))) goto LAB_00113048;
    ptVar2 = ptVar2 + 3;
  }
  lVar1 = 0xffffffff;
LAB_00113048:
  return (int)lVar1;
}

Assistant:

static int scheduleUop(ExecutionPort::type uop, ExecutionPort::type(&portBusy)[CYCLE_MAP_SIZE][3], int cycle) {
		//The scheduling here is done optimistically by checking port availability in order P5 -> P0 -> P1 to not overload
		//port P1 (multiplication) by instructions that can go to any port.
		for (; cycle < CYCLE_MAP_SIZE; ++cycle) {
			if ((uop & ExecutionPort::P5) != 0 && !portBusy[cycle][2]) {
				if (commit) {
					if (trace) std::cout << "; P5 at cycle " << cycle << std::endl;
					portBusy[cycle][2] = uop;
				}
				return cycle;
			}
			if ((uop & ExecutionPort::P0) != 0 && !portBusy[cycle][0]) {
				if (commit) {
					if (trace) std::cout << "; P0 at cycle " << cycle << std::endl;
					portBusy[cycle][0] = uop;
				}
				return cycle;
			}
			if ((uop & ExecutionPort::P1) != 0 && !portBusy[cycle][1]) {
				if (commit) {
					if (trace) std::cout << "; P1 at cycle " << cycle << std::endl;
					portBusy[cycle][1] = uop;
				}
				return cycle;
			}
		}
		return -1;
	}